

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaL_loadfile(lua_State *L,char *filename)

{
  int iVar1;
  int iVar2;
  char *chunkname;
  int local_203c;
  int fnameindex;
  int c;
  int readstatus;
  int status;
  LoadF lf;
  char *filename_local;
  lua_State *L_local;
  
  lf.buff._8184_8_ = filename;
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 + 1;
  readstatus = 0;
  if (lf.buff._8184_8_ == 0) {
    lua_pushlstring(L,"=stdin",6);
    lf.extraline = _stdin;
    lf._4_4_ = stdin_4;
  }
  else {
    lua_pushfstring(L,"@%s",lf.buff._8184_8_);
    lf._0_8_ = fopen((char *)lf.buff._8184_8_,"r");
    if ((FILE *)lf._0_8_ == (FILE *)0x0) {
      iVar1 = errfile(L,"open",iVar1);
      return iVar1;
    }
  }
  local_203c = getc((FILE *)lf._0_8_);
  if (local_203c == 0x23) {
    readstatus = 1;
    do {
      local_203c = getc((FILE *)lf._0_8_);
    } while (local_203c != -1 && local_203c != 10);
    if (local_203c == 10) {
      local_203c = getc((FILE *)lf._0_8_);
    }
  }
  if ((local_203c == 0x1b) && (lf.buff._8184_8_ != 0)) {
    lf._0_8_ = freopen((char *)lf.buff._8184_8_,"rb",(FILE *)lf._0_8_);
    if ((FILE *)lf._0_8_ == (FILE *)0x0) {
      iVar1 = errfile(L,"reopen",iVar1);
      return iVar1;
    }
    do {
      local_203c = getc((FILE *)lf._0_8_);
    } while (local_203c != -1 && local_203c != 0x1b);
    readstatus = 0;
  }
  ungetc(local_203c,(FILE *)lf._0_8_);
  chunkname = lua_tolstring(L,-1,(size_t *)0x0);
  L_local._4_4_ = lua_load(L,getF,&readstatus,chunkname);
  iVar2 = ferror((FILE *)lf._0_8_);
  if (lf.buff._8184_8_ != 0) {
    fclose((FILE *)lf._0_8_);
  }
  if (iVar2 == 0) {
    lua_remove(L,iVar1);
  }
  else {
    lua_settop(L,iVar1);
    L_local._4_4_ = errfile(L,"read",iVar1);
  }
  return L_local._4_4_;
}

Assistant:

static int luaL_loadfile(lua_State*L,const char*filename){
LoadF lf;
int status,readstatus;
int c;
int fnameindex=lua_gettop(L)+1;
lf.extraline=0;
if(filename==NULL){
lua_pushliteral(L,"=stdin");
lf.f=stdin;
}
else{
lua_pushfstring(L,"@%s",filename);
lf.f=fopen(filename,"r");
if(lf.f==NULL)return errfile(L,"open",fnameindex);
}
c=getc(lf.f);
if(c=='#'){
lf.extraline=1;
while((c=getc(lf.f))!=EOF&&c!='\n');
if(c=='\n')c=getc(lf.f);
}
if(c=="\033Lua"[0]&&filename){
lf.f=freopen(filename,"rb",lf.f);
if(lf.f==NULL)return errfile(L,"reopen",fnameindex);
while((c=getc(lf.f))!=EOF&&c!="\033Lua"[0]);
lf.extraline=0;
}
ungetc(c,lf.f);
status=lua_load(L,getF,&lf,lua_tostring(L,-1));
readstatus=ferror(lf.f);
if(filename)fclose(lf.f);
if(readstatus){
lua_settop(L,fnameindex);
return errfile(L,"read",fnameindex);
}
lua_remove(L,fnameindex);
return status;
}